

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O2

btBroadphasePair * __thiscall
btSortedOverlappingPairCache::addOverlappingPair
          (btSortedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  btOverlappingPairCallback *pbVar1;
  btBroadphaseProxy *pbVar2;
  bool bVar3;
  btBroadphasePair *pbVar4;
  btBroadphaseProxy *pbVar5;
  
  bVar3 = needsBroadphaseCollision(this,proxy0,proxy1);
  if (bVar3) {
    pbVar4 = btAlignedObjectArray<btBroadphasePair>::expandNonInitializing
                       (&this->m_overlappingPairArray);
    pbVar5 = proxy0;
    pbVar2 = proxy1;
    if (proxy0->m_uniqueId < proxy1->m_uniqueId) {
      pbVar5 = proxy1;
      pbVar2 = proxy0;
    }
    pbVar4->m_pProxy0 = pbVar2;
    pbVar4->m_pProxy1 = pbVar5;
    pbVar4->m_algorithm = (btCollisionAlgorithm *)0x0;
    (pbVar4->field_3).m_internalInfo1 = (void *)0x0;
    gOverlappingPairs = gOverlappingPairs + 1;
    gAddedPairs = gAddedPairs + 1;
    pbVar1 = this->m_ghostPairCallback;
    if (pbVar1 != (btOverlappingPairCallback *)0x0) {
      (*pbVar1->_vptr_btOverlappingPairCallback[2])(pbVar1,proxy0,proxy1);
    }
  }
  else {
    pbVar4 = (btBroadphasePair *)0x0;
  }
  return pbVar4;
}

Assistant:

btBroadphasePair*	btSortedOverlappingPairCache::addOverlappingPair(btBroadphaseProxy* proxy0,btBroadphaseProxy* proxy1)
{
	//don't add overlap with own
	btAssert(proxy0 != proxy1);

	if (!needsBroadphaseCollision(proxy0,proxy1))
		return 0;
	
	void* mem = &m_overlappingPairArray.expandNonInitializing();
	btBroadphasePair* pair = new (mem) btBroadphasePair(*proxy0,*proxy1);
	
	gOverlappingPairs++;
	gAddedPairs++;
	
	if (m_ghostPairCallback)
		m_ghostPairCallback->addOverlappingPair(proxy0, proxy1);
	return pair;
	
}